

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O2

void __thiscall
GetOpt::OptionsFileNotFoundEx::OptionsFileNotFoundEx(OptionsFileNotFoundEx *this,string *file)

{
  this->super_GetOptEx = (GetOptEx)&PTR__OptionsFileNotFoundEx_00126b08;
  std::__cxx11::string::string((string *)&this->targetFile,(string *)file);
  return;
}

Assistant:

OptionsFileNotFoundEx(const std::string& file) : targetFile(file) {}